

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

void Abc_NtkFraigStoreClean(void)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk_00;
  undefined4 local_1c;
  int i;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vStore;
  
  p = Abc_FrameReadStore();
  for (local_1c = 0; iVar1 = Vec_PtrSize(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(p,local_1c);
    Abc_NtkDelete(pNtk_00);
  }
  Vec_PtrClear(p);
  return;
}

Assistant:

void Abc_NtkFraigStoreClean()
{
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk;
    int i;
    vStore = Abc_FrameReadStore();
    Vec_PtrForEachEntry( Abc_Ntk_t *, vStore, pNtk, i )
        Abc_NtkDelete( pNtk );
    Vec_PtrClear( vStore );
}